

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiImplementation::compressedFormatInfo
          (QRhiImplementation *this,Format format,QSize *size,quint32 *bpl,quint32 *byteSize,
          QSize *blockDim)

{
  long lVar1;
  int iVar2;
  int *in_RCX;
  QSize *this_00;
  int in_ESI;
  int *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  quint32 hblocks;
  quint32 wblocks;
  quint32 blockSize;
  int ydim;
  int xdim;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int local_4c;
  int local_48;
  int local_44;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 4;
  local_48 = 4;
  local_4c = 0;
  this_00 = (QSize *)(ulong)(in_ESI - 0x1a);
  switch(this_00) {
  case (QSize *)0x0:
    local_4c = 8;
    break;
  case (QSize *)0x1:
    local_4c = 0x10;
    break;
  case (QSize *)0x2:
    local_4c = 0x10;
    break;
  case (QSize *)0x3:
    local_4c = 8;
    break;
  case (QSize *)0x4:
    local_4c = 0x10;
    break;
  case (QSize *)0x5:
    local_4c = 0x10;
    break;
  case (QSize *)0x6:
    local_4c = 0x10;
    break;
  case (QSize *)0x7:
    local_4c = 8;
    break;
  case (QSize *)0x8:
    local_4c = 8;
    break;
  case (QSize *)0x9:
    local_4c = 0x10;
    break;
  case (QSize *)0xa:
    local_4c = 0x10;
    break;
  case (QSize *)0xb:
    local_4c = 0x10;
    local_44 = 5;
    break;
  case (QSize *)0xc:
    local_4c = 0x10;
    local_48 = 5;
    local_44 = 5;
    break;
  case (QSize *)0xd:
    local_4c = 0x10;
    local_44 = 6;
    local_48 = 5;
    break;
  case (QSize *)0xe:
    local_4c = 0x10;
    local_48 = 6;
    local_44 = 6;
    break;
  case (QSize *)0xf:
    local_4c = 0x10;
    local_44 = 8;
    local_48 = 5;
    break;
  case (QSize *)0x10:
    local_4c = 0x10;
    local_44 = 8;
    local_48 = 6;
    break;
  case (QSize *)0x11:
    local_4c = 0x10;
    local_48 = 8;
    local_44 = 8;
    break;
  case (QSize *)0x12:
    local_4c = 0x10;
    local_44 = 10;
    local_48 = 5;
    break;
  case (QSize *)0x13:
    local_4c = 0x10;
    local_44 = 10;
    local_48 = 6;
    break;
  case (QSize *)0x14:
    local_4c = 0x10;
    local_44 = 10;
    local_48 = 8;
    break;
  case (QSize *)0x15:
    local_4c = 0x10;
    local_48 = 10;
    local_44 = 10;
    break;
  case (QSize *)0x16:
    local_4c = 0x10;
    local_44 = 0xc;
    local_48 = 10;
    break;
  case (QSize *)0x17:
    local_4c = 0x10;
    local_48 = 0xc;
    local_44 = 0xc;
  }
  iVar2 = QSize::width((QSize *)0x6943f5);
  local_44 = (iVar2 + local_44 + -1) / local_44;
  iVar2 = QSize::height((QSize *)0x69440f);
  if (in_RCX != (int *)0x0) {
    *in_RCX = local_44 * local_4c;
  }
  if (in_R8 != (int *)0x0) {
    *in_R8 = local_44 * ((iVar2 + local_48 + -1) / local_48) * local_4c;
  }
  if (in_R9 != (undefined8 *)0x0) {
    QSize::QSize(this_00,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
    *in_R9 = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiImplementation::compressedFormatInfo(QRhiTexture::Format format, const QSize &size,
                                              quint32 *bpl, quint32 *byteSize,
                                              QSize *blockDim) const
{
    int xdim = 4;
    int ydim = 4;
    quint32 blockSize = 0;

    switch (format) {
    case QRhiTexture::BC1:
        blockSize = 8;
        break;
    case QRhiTexture::BC2:
        blockSize = 16;
        break;
    case QRhiTexture::BC3:
        blockSize = 16;
        break;
    case QRhiTexture::BC4:
        blockSize = 8;
        break;
    case QRhiTexture::BC5:
        blockSize = 16;
        break;
    case QRhiTexture::BC6H:
        blockSize = 16;
        break;
    case QRhiTexture::BC7:
        blockSize = 16;
        break;

    case QRhiTexture::ETC2_RGB8:
        blockSize = 8;
        break;
    case QRhiTexture::ETC2_RGB8A1:
        blockSize = 8;
        break;
    case QRhiTexture::ETC2_RGBA8:
        blockSize = 16;
        break;

    case QRhiTexture::ASTC_4x4:
        blockSize = 16;
        break;
    case QRhiTexture::ASTC_5x4:
        blockSize = 16;
        xdim = 5;
        break;
    case QRhiTexture::ASTC_5x5:
        blockSize = 16;
        xdim = ydim = 5;
        break;
    case QRhiTexture::ASTC_6x5:
        blockSize = 16;
        xdim = 6;
        ydim = 5;
        break;
    case QRhiTexture::ASTC_6x6:
        blockSize = 16;
        xdim = ydim = 6;
        break;
    case QRhiTexture::ASTC_8x5:
        blockSize = 16;
        xdim = 8;
        ydim = 5;
        break;
    case QRhiTexture::ASTC_8x6:
        blockSize = 16;
        xdim = 8;
        ydim = 6;
        break;
    case QRhiTexture::ASTC_8x8:
        blockSize = 16;
        xdim = ydim = 8;
        break;
    case QRhiTexture::ASTC_10x5:
        blockSize = 16;
        xdim = 10;
        ydim = 5;
        break;
    case QRhiTexture::ASTC_10x6:
        blockSize = 16;
        xdim = 10;
        ydim = 6;
        break;
    case QRhiTexture::ASTC_10x8:
        blockSize = 16;
        xdim = 10;
        ydim = 8;
        break;
    case QRhiTexture::ASTC_10x10:
        blockSize = 16;
        xdim = ydim = 10;
        break;
    case QRhiTexture::ASTC_12x10:
        blockSize = 16;
        xdim = 12;
        ydim = 10;
        break;
    case QRhiTexture::ASTC_12x12:
        blockSize = 16;
        xdim = ydim = 12;
        break;

    default:
        Q_UNREACHABLE();
        break;
    }

    const quint32 wblocks = uint((size.width() + xdim - 1) / xdim);
    const quint32 hblocks = uint((size.height() + ydim - 1) / ydim);

    if (bpl)
        *bpl = wblocks * blockSize;
    if (byteSize)
        *byteSize = wblocks * hblocks * blockSize;
    if (blockDim)
        *blockDim = QSize(xdim, ydim);
}